

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O1

void __thiscall
dg::GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildCFG
          (GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *this,
          SubgraphInfo *subginfo)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  __node_base_ptr p_Var3;
  int iVar4;
  long lVar5;
  _Hash_node_base *p_Var6;
  __node_base_ptr p_Var7;
  __hash_code __code;
  __node_base_ptr p_Var8;
  int iVar9;
  
  for (p_Var1 = (subginfo->blocks)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    p_Var2 = p_Var1[2]._M_nxt;
    lVar5 = llvm::BasicBlock::getTerminator();
    iVar4 = 0;
    if (lVar5 != 0) {
      iVar4 = llvm::Instruction::getNumSuccessors();
    }
    if (iVar4 != 0) {
      iVar9 = 0;
      do {
        p_Var6 = (_Hash_node_base *)llvm::Instruction::getSuccessor((uint)lVar5);
        p_Var8 = (subginfo->blocks)._M_h._M_buckets
                 [(ulong)p_Var6 % (subginfo->blocks)._M_h._M_bucket_count];
        p_Var3 = p_Var8->_M_nxt;
        while (p_Var7 = p_Var3, p_Var6 != p_Var7[1]._M_nxt) {
          p_Var8 = p_Var7;
          p_Var3 = p_Var7->_M_nxt;
        }
        ElemWithEdges<dg::dda::RWBBlock>::addSuccessor
                  ((ElemWithEdges<dg::dda::RWBBlock> *)(p_Var2 + 1),
                   (RWBBlock *)p_Var8->_M_nxt[2]._M_nxt);
        iVar9 = iVar9 + 1;
      } while (iVar9 != iVar4);
    }
  }
  return;
}

Assistant:

void buildCFG(SubgraphInfo &subginfo) {
        for (auto &it : subginfo.blocks) {
            auto llvmblk = it.first;
            auto *bblock = it.second;

            for (auto *succ : successors(llvmblk)) {
                auto succit = subginfo.blocks.find(succ);
                assert((succit != subginfo.blocks.end()) &&
                       "Do not have the block built");

                bblock->addSuccessor(succit->second);
            }
        }
    }